

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

char * __thiscall
MT32Emu::Synth::getSoundGroupName(Synth *this,Bit8u timbreGroup,Bit8u timbreNumber)

{
  undefined3 in_register_00000031;
  
  switch(CONCAT31(in_register_00000031,timbreGroup)) {
  case 0:
    goto switchD_001798af_caseD_0;
  case 1:
    timbreNumber = timbreNumber + 0x40;
switchD_001798af_caseD_0:
    return this->soundGroupNames[this->soundGroupIx[timbreNumber]];
  case 2:
    return this->soundGroupNames[(ulong)this->controlROMMap->soundGroupsCount - 2];
  case 3:
    return this->soundGroupNames[(ulong)this->controlROMMap->soundGroupsCount - 1];
  default:
    return (char *)0x0;
  }
}

Assistant:

const char *Synth::getSoundGroupName(Bit8u timbreGroup, Bit8u timbreNumber) const {
	switch (timbreGroup) {
	case 1:
		timbreNumber += 64;
		// Fall-through
	case 0:
		return soundGroupNames[soundGroupIx[timbreNumber]];
	case 2:
		return soundGroupNames[controlROMMap->soundGroupsCount - 2];
	case 3:
		return soundGroupNames[controlROMMap->soundGroupsCount - 1];
	default:
		return NULL;
	}
}